

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O3

Vec_Int_t * Io_WriteAigerLiterals(Abc_Ntk_t *pNtk)

{
  int iVar1;
  long *plVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = pNtk->vCos->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar3;
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[lVar6];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)plVar2[4] * 8) + 0x40);
        Vec_IntPush(p,((uint)(iVar1 == 0) ^ *(uint *)((long)plVar2 + 0x14) >> 10 & 1) + iVar1 * 2);
        pVVar4 = pNtk->vBoxes;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar4->nSize);
  }
  pVVar4 = pNtk->vPos;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[lVar6];
      iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                (long)*(int *)plVar2[4] * 8) + 0x40);
      Vec_IntPush(p,((uint)(iVar1 == 0) ^ *(uint *)((long)plVar2 + 0x14) >> 10 & 1) + iVar1 * 2);
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vPos;
    } while (lVar6 < pVVar4->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Io_WriteAigerLiterals( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vLits;
    Abc_Obj_t * pObj, * pDriver;
    int i;
    vLits = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        Vec_IntPush( vLits, Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        Vec_IntPush( vLits, Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    return vLits;
}